

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
HdlcSimulationDataGenerator::GenerateAbortFramesIndexes(HdlcSimulationDataGenerator *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator iVar1;
  int iVar2;
  uint local_14;
  
  this_00 = &this->mAbortFramesIndexes;
  iVar2 = rand();
  iVar1._M_current =
       (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = iVar2 % 0x32;
    (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar2 = rand();
  iVar1._M_current =
       (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = iVar2 % 0x32;
    (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar2 = rand();
  iVar1._M_current =
       (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = iVar2 % 0x32;
    (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar2 = rand();
  iVar1._M_current =
       (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = iVar2 % 0x32;
    (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar2 = rand();
  iVar1._M_current =
       (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = iVar2 % 0x32;
    (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar2 = rand();
  iVar1._M_current =
       (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (this_00,iVar1,&local_14);
  }
  else {
    *iVar1._M_current = iVar2 % 0x32;
    (this->mAbortFramesIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void HdlcSimulationDataGenerator::GenerateAbortFramesIndexes()
{
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
    mAbortFramesIndexes.push_back( rand() % 50 );
}